

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O3

QString * __thiscall
QAccessibleMenuItem::text(QString *__return_storage_ptr__,QAccessibleMenuItem *this,Text t)

{
  undefined4 uVar1;
  Data *pDVar2;
  undefined4 uVar3;
  char cVar4;
  long in_FS_OFFSET;
  QKeySequence key;
  undefined1 *local_58;
  QString local_50;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (t == Accelerator) {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    QAction::shortcut();
    cVar4 = QKeySequence::isEmpty();
    if (cVar4 == '\0') {
      QKeySequence::toString((SequenceFormat)&local_38);
      pDVar2 = local_38.d.d;
      local_38.d.d = (Data *)0x0;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = local_38.d.ptr;
      local_38.d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = local_38.d.size;
    }
    else {
      QAction::text();
      qt_accHotKey(&local_38,&local_50);
      pDVar2 = local_38.d.d;
      local_38.d.d = (Data *)0x0;
      (__return_storage_ptr__->d).d = pDVar2;
      (__return_storage_ptr__->d).ptr = local_38.d.ptr;
      local_38.d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = local_38.d.size;
      local_38.d.size = 0;
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    QKeySequence::~QKeySequence((QKeySequence *)&local_58);
  }
  else if (t == Name) {
    QAction::text();
    qt_accStripAmp(&local_38,&local_50);
    uVar1 = local_38.d.d._0_4_;
    uVar3 = local_38.d.d._4_4_;
    local_38.d.d = (Data *)0x0;
    *(undefined4 *)&(__return_storage_ptr__->d).d = uVar1;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar3;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_38.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_38.d.ptr._4_4_;
    local_38.d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = local_38.d.size;
    local_38.d.size = 0;
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QAccessibleMenuItem::text(QAccessible::Text t) const
{
    QString str;
    switch (t) {
    case QAccessible::Name:
        str = qt_accStripAmp(m_action->text());
        break;
    case QAccessible::Accelerator: {
#ifndef QT_NO_SHORTCUT
        QKeySequence key = m_action->shortcut();
        if (!key.isEmpty()) {
            str = key.toString();
        } else
#endif
        {
            str = qt_accHotKey(m_action->text());
        }
        break;
    }
    default:
        break;
    }
    return str;
}